

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

string * __thiscall
cmCTest::GetShortPathToFile(string *__return_storage_ptr__,cmCTest *this,string *cfname)

{
  ulong uVar1;
  ulong uVar2;
  string *path;
  string fname;
  string srcRelpath;
  string bldRelpath;
  string sStack_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_e8,"SourceDirectory",(allocator<char> *)&local_c8);
  GetCTestConfiguration(&local_a8,this,&sStack_e8);
  cmsys::SystemTools::CollapseFullPath(&local_68,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&sStack_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"BuildDirectory",(allocator<char> *)&local_88);
  GetCTestConfiguration(&sStack_e8,this,&local_c8);
  cmsys::SystemTools::CollapseFullPath(&local_a8,&sStack_e8);
  std::__cxx11::string::~string((string *)&sStack_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  cmsys::SystemTools::CollapseFullPath(&sStack_e8,cfname);
  cmSystemTools::RelativePath(&local_c8,&local_68,&sStack_e8);
  cmSystemTools::RelativePath(&local_88,&local_a8,&sStack_e8);
  uVar1 = std::__cxx11::string::find((char *)&local_c8,0x65180b);
  uVar2 = std::__cxx11::string::find((char *)&local_88,0x65180b);
  if ((uVar2 & uVar1) == 0xffffffffffffffff) {
    path = &local_88;
    if (local_c8._M_string_length < local_88._M_string_length) {
      path = &local_c8;
    }
  }
  else {
    path = (string *)0x0;
    if (uVar2 == 0xffffffffffffffff) {
      path = &local_88;
    }
    if (uVar1 == 0xffffffffffffffff) {
      path = &local_c8;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (path == (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  else {
    cmsys::SystemTools::ConvertToUnixSlashes(path);
    std::operator+(&local_48,"./",path);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    if ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] ==
        '/') {
      std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    }
  }
  cmsys::SystemTools::ReplaceString(__return_storage_ptr__,":","_");
  cmsys::SystemTools::ReplaceString(__return_storage_ptr__," ","_");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&sStack_e8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::GetShortPathToFile(const std::string& cfname)
{
  const std::string& sourceDir = cmSystemTools::CollapseFullPath(
    this->GetCTestConfiguration("SourceDirectory"));
  const std::string& buildDir = cmSystemTools::CollapseFullPath(
    this->GetCTestConfiguration("BuildDirectory"));
  std::string fname = cmSystemTools::CollapseFullPath(cfname);

  // Find relative paths to both directories
  std::string srcRelpath = cmSystemTools::RelativePath(sourceDir, fname);
  std::string bldRelpath = cmSystemTools::RelativePath(buildDir, fname);

  // If any contains "." it is not parent directory
  bool inSrc = srcRelpath.find("..") == std::string::npos;
  bool inBld = bldRelpath.find("..") == std::string::npos;
  // TODO: Handle files with .. in their name

  std::string* res = nullptr;

  if (inSrc && inBld) {
    // If both have relative path with no dots, pick the shorter one
    if (srcRelpath.size() < bldRelpath.size()) {
      res = &srcRelpath;
    } else {
      res = &bldRelpath;
    }
  } else if (inSrc) {
    res = &srcRelpath;
  } else if (inBld) {
    res = &bldRelpath;
  }

  std::string path;

  if (!res) {
    path = fname;
  } else {
    cmSystemTools::ConvertToUnixSlashes(*res);

    path = "./" + *res;
    if (path.back() == '/') {
      path.resize(path.size() - 1);
    }
  }

  cmsys::SystemTools::ReplaceString(path, ":", "_");
  cmsys::SystemTools::ReplaceString(path, " ", "_");
  return path;
}